

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O3

bool __thiscall AV1Kmeans::AV1KmeansTest1::CheckResult(AV1KmeansTest1 *this,int n)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = true;
  if (0 < n) {
    if (this->indices1_[0] == this->indices2_[0]) {
      uVar3 = 0;
      do {
        if ((ulong)(uint)n - 1 == uVar3) {
          return true;
        }
        lVar1 = uVar3 + 1;
        uVar4 = uVar3 + 1;
        lVar2 = uVar3 + 1;
        uVar3 = uVar4;
      } while (this->indices1_[lVar1] == this->indices2_[lVar2]);
      bVar5 = (uint)n <= uVar4;
    }
    else {
      uVar4 = 0;
      bVar5 = false;
    }
    printf("%d ",uVar4 & 0xffffffff);
    printf("%d != %d ",(ulong)this->indices1_[uVar4],(ulong)this->indices2_[uVar4]);
  }
  return bVar5;
}

Assistant:

bool CheckResult(int n) {
    for (int idx = 0; idx < n; ++idx) {
      if (indices1_[idx] != indices2_[idx]) {
        printf("%d ", idx);
        printf("%d != %d ", indices1_[idx], indices2_[idx]);
        return false;
      }
    }
    return true;
  }